

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::Clear(ExtensionRangeOptions_Declaration *this)

{
  ulong uVar1;
  anon_union_32_1_493b367e_for_ExtensionRangeOptions_Declaration_3 aVar2;
  undefined8 *puVar3;
  LogMessageFatal LStack_18;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x3) != (undefined1  [32])0x0) {
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 8);
      if ((uVar1 & 3) == 0) goto LAB_002577e6;
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 0x10);
      if ((uVar1 & 3) == 0) {
LAB_002577e6:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
                   ,0x20b,"!tagged_ptr_.IsDefault()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
  }
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x1c) != (undefined1  [32])0x0) {
    *(undefined2 *)((long)&this->field_0 + 0x1c) = 0;
    (this->field_0)._impl_.number_ = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ExtensionRangeOptions_Declaration::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.ExtensionRangeOptions.Declaration)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.full_name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.type_.ClearNonDefaultToEmpty();
    }
  }
  if ((cached_has_bits & 0x0000001cu) != 0) {
    ::memset(&_impl_.number_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.repeated_) -
        reinterpret_cast<char*>(&_impl_.number_)) + sizeof(_impl_.repeated_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}